

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O0

int fits_img_decompress_header(fitsfile *infptr,fitsfile *outfptr,int *status)

{
  int iVar1;
  long local_e8;
  long naxes [6];
  int local_b0;
  int bitpix;
  int naxis;
  int ii;
  char card [81];
  int local_48;
  int local_44;
  int tstatus;
  int norec;
  int copyprime;
  int nullprime;
  int numkeys;
  int inhdupos;
  int hdupos;
  int writeprime;
  int *status_local;
  fitsfile *outfptr_local;
  fitsfile *infptr_local;
  
  norec = 0;
  tstatus = 0;
  local_44 = 0;
  if (*status < 1) {
    iVar1 = *status;
    if (iVar1 == -1) {
      *status = 0;
    }
    inhdupos = (int)(iVar1 == -1);
    _hdupos = status;
    status_local = &outfptr->HDUposition;
    outfptr_local = infptr;
    iVar1 = fits_is_compressed_image(infptr,status);
    if (iVar1 == 0) {
      ffpmsg("CHDU is not a compressed image (fits_img_decompress)");
      *_hdupos = 0x19e;
      infptr_local._4_4_ = 0x19e;
    }
    else {
      ffghdn(outfptr_local,&nullprime);
      ffghdn((fitsfile *)status_local,&numkeys);
      ffghsp((fitsfile *)status_local,&copyprime,(int *)0x0,_hdupos);
      local_48 = 0;
      iVar1 = ffgcrd(outfptr_local,"ZSIMPLE",(char *)&naxis,&local_48);
      if ((iVar1 == 0) && (numkeys == 1)) {
        if (copyprime == 0) {
          norec = 1;
        }
        else {
          ffgipr((fitsfile *)status_local,6,(int *)((long)naxes + 0x2c),&local_b0,&local_e8,_hdupos)
          ;
          if ((local_b0 == 0) && (norec = 1, nullprime == 2)) {
            tstatus = 1;
          }
        }
      }
      if (norec == 0) {
        local_48 = 0;
        iVar1 = ffgcrd(outfptr_local,"ZTENSION",(char *)&naxis,&local_48);
        if (iVar1 == 0) {
          if (inhdupos == 0) {
            if (copyprime == 0) {
              ffcrim((fitsfile *)status_local,8,0,&local_e8,_hdupos);
              iVar1 = ffcrhd((fitsfile *)status_local,_hdupos);
              if (0 < iVar1) {
                ffpmsg("error creating output decompressed image HDU");
                return *_hdupos;
              }
            }
            else {
              ffcrhd((fitsfile *)status_local,_hdupos);
            }
          }
          else {
            iVar1 = ffcrim((fitsfile *)status_local,outfptr_local->Fptr->zbitpix,
                           outfptr_local->Fptr->zndim,outfptr_local->Fptr->znaxis,_hdupos);
            if (0 < iVar1) {
              ffpmsg("error creating output decompressed image HDU");
              return *_hdupos;
            }
            local_44 = 1;
          }
        }
        else {
          iVar1 = ffcrim((fitsfile *)status_local,outfptr_local->Fptr->zbitpix,
                         outfptr_local->Fptr->zndim,outfptr_local->Fptr->znaxis,_hdupos);
          if (0 < iVar1) {
            ffpmsg("error creating output decompressed image HDU");
            return *_hdupos;
          }
          local_44 = 1;
        }
      }
      else {
        for (bitpix = copyprime; 0 < bitpix; bitpix = bitpix + -1) {
          ffdrec((fitsfile *)status_local,bitpix,_hdupos);
        }
      }
      if (*_hdupos < 1) {
        iVar1 = imcomp_copy_comp2img(outfptr_local,(fitsfile *)status_local,local_44,_hdupos);
        if (0 < iVar1) {
          ffpmsg("error copying header keywords from compressed image");
        }
        if (tstatus != 0) {
          ffmahd(outfptr_local,1,(int *)0x0,_hdupos);
          ffrdef((fitsfile *)status_local,_hdupos);
          iVar1 = imcomp_copy_prime2img(outfptr_local,(fitsfile *)status_local,_hdupos);
          if (0 < iVar1) {
            ffpmsg("error copying primary keywords from compressed file");
          }
          ffmahd(outfptr_local,2,(int *)0x0,_hdupos);
        }
        infptr_local._4_4_ = *_hdupos;
      }
      else {
        ffpmsg("error creating output decompressed image HDU");
        infptr_local._4_4_ = *_hdupos;
      }
    }
  }
  else {
    infptr_local._4_4_ = *status;
  }
  return infptr_local._4_4_;
}

Assistant:

int fits_img_decompress_header(fitsfile *infptr, /* image (bintable) to uncompress */
              fitsfile *outfptr,   /* empty HDU for output uncompressed image */
              int *status)         /* IO - error status               */

/* 
  This routine reads the header of the input tile compressed image and 
  converts it to that of a standard uncompress FITS image.
*/

{
    int writeprime = 0;
    int hdupos, inhdupos, numkeys;
    int nullprime = 0, copyprime = 0, norec = 0, tstatus;
    char card[FLEN_CARD];
    int ii, naxis, bitpix;
    long naxes[MAX_COMPRESS_DIM];

    if (*status > 0)
        return(*status);
    else if (*status == -1) {
        *status = 0;
	writeprime = 1;
    }

    if (!fits_is_compressed_image(infptr, status) )
    {
        ffpmsg("CHDU is not a compressed image (fits_img_decompress)");
        return(*status = DATA_DECOMPRESSION_ERR);
    }

    /* get information about the state of the output file; does it already */
    /* contain any keywords and HDUs?  */
    fits_get_hdu_num(infptr, &inhdupos);  /* Get the current output HDU position */
    fits_get_hdu_num(outfptr, &hdupos);  /* Get the current output HDU position */
    fits_get_hdrspace(outfptr, &numkeys, 0, status);

    /* Was the input compressed HDU originally the primary array image? */
    tstatus = 0;
    if (!fits_read_card(infptr, "ZSIMPLE", card, &tstatus)) { 
      /* yes, input HDU was a primary array (not an IMAGE extension) */
      /* Now determine if we can uncompress it into the primary array of */
      /* the output file.  This is only possible if the output file */
      /* currently only contains a null primary array, with no addition */
      /* header keywords and with no following extension in the FITS file. */
      
      if (hdupos == 1) {  /* are we positioned at the primary array? */
            if (numkeys == 0) { /* primary HDU is completely empty */
	        nullprime = 1;
            } else {
                fits_get_img_param(outfptr, MAX_COMPRESS_DIM, &bitpix, &naxis, naxes, status);
	
	        if (naxis == 0) { /* is this a null image? */
                   nullprime = 1;

		   if (inhdupos == 2)  /* must be at the first extension */
		      copyprime = 1;
		}
           }
      }
    } 

    if (nullprime) {  
       /* We will delete the existing keywords in the null primary array
          and uncompress the input image into the primary array of the output.
	  Some of these keywords may be added back to the uncompressed image
	  header later.
       */

       for (ii = numkeys; ii > 0; ii--)
          fits_delete_record(outfptr, ii, status);

    } else  {

       /* if the ZTENSION keyword doesn't exist, then we have to 
          write the required keywords manually */
       tstatus = 0;
       if (fits_read_card(infptr, "ZTENSION", card, &tstatus)) {

          /* create an empty output image with the correct dimensions */
          if (ffcrim(outfptr, (infptr->Fptr)->zbitpix, (infptr->Fptr)->zndim, 
             (infptr->Fptr)->znaxis, status) > 0)
          {
             ffpmsg("error creating output decompressed image HDU");
    	     return (*status);
          }

	  norec = 1;  /* the required keywords have already been written */

       } else {  /* the input compressed image does have ZTENSION keyword */
       
          if (writeprime) {  /* convert the image extension to a primary array */
	      /* have to write the required keywords manually */

              /* create an empty output image with the correct dimensions */
              if (ffcrim(outfptr, (infptr->Fptr)->zbitpix, (infptr->Fptr)->zndim, 
                 (infptr->Fptr)->znaxis, status) > 0)
              {
                 ffpmsg("error creating output decompressed image HDU");
    	         return (*status);
              }

	      norec = 1;  /* the required keywords have already been written */

          } else {  /* write the input compressed image to an image extension */

              if (numkeys == 0) {  /* the output file is currently completely empty */
	  
	         /* In this case, the input is a compressed IMAGE extension. */
	         /* Since the uncompressed output file is currently completely empty, */
	         /* we need to write a null primary array before uncompressing the */
                 /* image extension */
	     
                 ffcrim(outfptr, 8, 0, naxes, status); /* naxes is not used */
	     
	         /* now create the empty extension to uncompress into */
                 if (fits_create_hdu(outfptr, status) > 0)
                 {
                      ffpmsg("error creating output decompressed image HDU");
    	              return (*status);
                 }
	  
	      } else {
                  /* just create a new empty extension, then copy all the required */
	          /* keywords into it.  */
                 fits_create_hdu(outfptr, status);
	      }
           }
       }

    }

    if (*status > 0)  {
        ffpmsg("error creating output decompressed image HDU");
    	return (*status);
    }

    /* Copy the table header to the image header. */

    if (imcomp_copy_comp2img(infptr, outfptr, norec, status) > 0)
    {
        ffpmsg("error copying header keywords from compressed image");
    }

    if (copyprime) {  
	/* append any unexpected keywords from the primary array.
	   This includes any keywords except SIMPLE, BITPIX, NAXIS,
	   EXTEND, COMMENT, HISTORY, CHECKSUM, and DATASUM.
	*/

        fits_movabs_hdu(infptr, 1, NULL, status);  /* move to primary array */
	
        /* do this so that any new keywords get written before any blank
	   keywords that may have been appended by imcomp_copy_comp2img  */
        fits_set_hdustruc(outfptr, status);

        if (imcomp_copy_prime2img(infptr, outfptr, status) > 0)
        {
            ffpmsg("error copying primary keywords from compressed file");
        }

        fits_movabs_hdu(infptr, 2, NULL, status); /* move back to where we were */
    }

    return (*status);
}